

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

char * read_line(FILE *file)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  undefined4 local_28;
  int isEnd;
  int i;
  int ch;
  char *res;
  int size;
  FILE *file_local;
  
  res._4_4_ = 0x100;
  _i = malloc(0x100);
  local_28 = 0;
  bVar1 = false;
  do {
    iVar2 = local_28;
    iVar3 = fgetc((FILE *)file);
    if (res._4_4_ <= local_28) {
      res._4_4_ = res._4_4_ + 0x100;
      _i = realloc(_i,(long)res._4_4_);
    }
    if ((iVar3 == 10) || (iVar3 == -1)) {
      *(undefined1 *)((long)_i + (long)local_28) = 0;
      bVar1 = true;
    }
    else {
      *(char *)((long)_i + (long)local_28) = (char)iVar3;
    }
    local_28 = local_28 + 1;
  } while (!bVar1);
  if ((0 < local_28) && (*(char *)((long)_i + (long)iVar2) == '\r')) {
    *(undefined1 *)((long)_i + (long)iVar2) = 0;
    local_28 = iVar2;
  }
  pcVar4 = (char *)realloc(_i,(long)local_28);
  return pcVar4;
}

Assistant:

char *read_line(FILE *file)
{
	int size = BLOCK_SIZE;
	char *res = malloc(BLOCK_SIZE * sizeof(char));
	int ch;
	int i = 0;
	int isEnd = 0;
	do
	{
		ch = fgetc(file);
		if (i >= size)
		{
			size += BLOCK_SIZE;
			res = realloc(res, size * sizeof(char));
		}
		if (ch == '\n' || ch == EOF)
		{
			res[i++] = '\0';
			isEnd = 1;
		}
		else
		{
			res[i++] = (char) ch;
		}
	} while (!isEnd);
	if (i > 0 && res[i - 1] == '\r')
    {
        res[i - 1] = '\0';
        i--;
    }
	return realloc(res, i * sizeof(char));
}